

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O2

int64_t __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::ConnectIndex
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra> *this,int elem,int connect)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  uVar4 = (ulong)(uint)elem;
  if (elem < 1) {
    uVar4 = uVar5;
  }
  iVar3 = 0;
  for (; uVar4 * 4 != uVar5; uVar5 = uVar5 + 4) {
    plVar1 = *(long **)((long)&((this->fElementVec).super_TPZVec<TPZCompElSide>.fStore)->fEl +
                       uVar5 * 4);
    if ((plVar1 != (long *)0x0) &&
       (*(int *)((long)(this->super_TPZMultiphysicsElement).fActiveApproxSpace.super_TPZVec<int>.
                       fStore + uVar5) != 0)) {
      iVar2 = (**(code **)(*plVar1 + 0x90))();
      iVar3 = iVar3 + iVar2;
    }
  }
  return (this->fConnectIndexes).fStore[iVar3 + connect];
}

Assistant:

int64_t TPZMultiphysicsCompEl<TGeometry>::ConnectIndex(int elem, int connect) const {
    
    int first = 0;
    for(int64_t el=0; el<elem; el++){
        TPZCompEl *cel = fElementVec[el].Element();
        if (cel && fActiveApproxSpace[el]) {
            first+=cel->NConnects();
        }
    }
    return fConnectIndexes[first+connect];
}